

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O3

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::empty_builder_movector_test(void)

{
  TestHeapBuilder dst;
  TestHeapBuilder src;
  FlatBufferBuilderImpl<false> FStack_108;
  FlatBufferBuilderImpl<false> local_88;
  
  local_88.buf_.allocator_ = (Allocator *)operator_new(8);
  (local_88.buf_.allocator_)->_vptr_Allocator = (_func_int **)&PTR__Allocator_001fcc08;
  local_88.buf_.own_allocator_ = true;
  local_88.buf_.initial_size_ = 0x800;
  local_88.buf_.max_size_ = 0x7fffffff;
  local_88.buf_.buffer_minalign_ = 8;
  local_88.buf_.reserved_ = 0;
  local_88.buf_.size_ = 0;
  local_88.length_of_64_bit_region_ = 0;
  local_88.nested = false;
  local_88.finished = false;
  local_88.buf_.scratch_._0_6_ = 0;
  local_88._78_8_ = 0;
  local_88.buf_.buf_ = (uint8_t *)0x0;
  local_88.buf_.cur_._0_6_ = 0;
  local_88.buf_.cur_._6_2_ = 0;
  local_88.minalign_ = 1;
  local_88.force_defaults_ = false;
  local_88.dedup_vtables_ = true;
  local_88.string_pool = (StringOffsetMap *)0x0;
  flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl(&FStack_108,&local_88);
  TestEq<unsigned_long,int>
            (0,0,"\'src_size\' != \'0\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
             ,0x57,
             "static void BuilderTests<TestHeapBuilder>::empty_builder_movector_test() [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
            );
  TestEq<unsigned_long,unsigned_long>
            (0,(ulong)FStack_108.buf_.size_,"\'src_size\' != \'dst_size\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
             ,0x58,
             "static void BuilderTests<TestHeapBuilder>::empty_builder_movector_test() [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
            );
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&FStack_108);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_88);
  return;
}

Assistant:

inline std::string m1_name() { return "Cyberdemon"; }